

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

void __thiscall irr::scene::CSceneManager::clearDeletionList(CSceneManager *this)

{
  array<irr::scene::ISceneNode_*> *paVar1;
  pointer ppIVar2;
  ISceneNode *pIVar3;
  _func_int *p_Var4;
  code *pcVar5;
  pointer ppIVar6;
  ulong uVar7;
  
  ppIVar6 = (this->DeletionList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->DeletionList).m_data.
            super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar6 != ppIVar2) {
    paVar1 = &this->DeletionList;
    if ((int)((ulong)((long)ppIVar2 - (long)ppIVar6) >> 3) != 0) {
      uVar7 = 0;
      do {
        (*ppIVar6[uVar7]->_vptr_ISceneNode[0x14])();
        ppIVar6 = (paVar1->m_data).
                  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = ppIVar6[uVar7];
        p_Var4 = pIVar3->_vptr_ISceneNode[-3];
        pcVar5 = (code *)((long)(pIVar3->AbsoluteTransformation).M + (long)(p_Var4 + -0x20));
        *(int *)pcVar5 = *(int *)pcVar5 + -1;
        if (*(int *)pcVar5 == 0) {
          pcVar5 = (code *)((long)(pIVar3->AbsoluteTransformation).M + (long)(p_Var4 + -0x30));
          (**(code **)(*(long *)pcVar5 + 8))(pcVar5);
          ppIVar6 = (paVar1->m_data).
                    super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < ((ulong)((long)(this->DeletionList).m_data.
                                      super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar6) >>
                        3 & 0xffffffff));
    }
    ppIVar2 = (this->DeletionList).m_data.
              super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (paVar1->m_data).
    super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->DeletionList).m_data.
    super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->DeletionList).m_data.
    super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar6 != (pointer)0x0) {
      operator_delete(ppIVar6,(long)ppIVar2 - (long)ppIVar6);
    }
    (this->DeletionList).is_sorted = true;
  }
  return;
}

Assistant:

void CSceneManager::clearDeletionList()
{
	if (DeletionList.empty())
		return;

	for (u32 i = 0; i < DeletionList.size(); ++i) {
		DeletionList[i]->remove();
		DeletionList[i]->drop();
	}

	DeletionList.clear();
}